

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

void OnDiskIndex::on_disk_merge
               (path *db_base,string *fname,IndexType merge_type,
               vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,TaskSpec *task)

{
  __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
  __last;
  __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
  __first;
  undefined1 uVar1;
  const_iterator buf;
  const_iterator count;
  runtime_error *this;
  OnDiskIndexHeader header;
  RawFile out;
  RawFile *in_stack_00000128;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *in_stack_00000130;
  path *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  anon_class_4_1_5c6fd09f __pred;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  RawFile *in_stack_ffffffffffffff20;
  undefined1 local_d0 [32];
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  RawFile *in_stack_ffffffffffffff60;
  string local_50 [80];
  
  __pred.merge_type = (IndexType)((ulong)local_d0 >> 0x20);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::experimental::filesystem::v1::__cxx11::operator/
            ((path *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (path *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffed8);
  RawFile::RawFile(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_50);
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  buf = std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::begin
                  ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                   in_stack_fffffffffffffed8);
  count = std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::end
                    ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                     in_stack_fffffffffffffed8);
  __first._M_current._4_4_ = in_stack_ffffffffffffff04;
  __first._M_current._0_4_ = in_stack_ffffffffffffff00;
  __last._M_current._4_4_ = in_stack_fffffffffffffefc;
  __last._M_current._0_4_ = in_stack_fffffffffffffef8;
  uVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<IndexMergeHelper_const*,std::vector<IndexMergeHelper,std::allocator<IndexMergeHelper>>>,OnDiskIndex::on_disk_merge(std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&,IndexType,std::vector<IndexMergeHelper,std::allocator<IndexMergeHelper>>const&,TaskSpec*)::__0>
                    (__first,__last,__pred);
  if (!(bool)uVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unexpected index type during merge");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RawFile::write<unsigned_char>
            (in_stack_ffffffffffffff20,(uchar *)buf._M_current,(size_t)count._M_current);
  on_disk_merge_core(in_stack_00000130,in_stack_00000128,(TaskSpec *)db_base);
  RawFile::~RawFile((RawFile *)CONCAT17(uVar1,in_stack_fffffffffffffee0));
  return;
}

Assistant:

void OnDiskIndex::on_disk_merge(const fs::path &db_base,
                                const std::string &fname, IndexType merge_type,
                                const std::vector<IndexMergeHelper> &indexes,
                                TaskSpec *task) {
    RawFile out(db_base / fname, O_WRONLY | O_CREAT | O_EXCL, 0600);

    if (!std::all_of(indexes.begin(), indexes.end(),
                     [merge_type](const IndexMergeHelper &ndx) {
                         return ndx.index->ntype == merge_type;
                     })) {
        throw std::runtime_error("Unexpected index type during merge");
    }

    OnDiskIndexHeader header;
    header.magic = DB_MAGIC;
    header.version = OnDiskIndex::VERSION;
    header.raw_type = static_cast<uint32_t>(merge_type);
    header.reserved = 0;

    out.write(reinterpret_cast<uint8_t *>(&header), sizeof(header));

    on_disk_merge_core(indexes, &out, task);
}